

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

bool __thiscall
libtorrent::peer_list::insert_peer
          (peer_list *this,torrent_peer *p,iterator *iter,pex_flags_t flags,torrent_state *state)

{
  int iVar1;
  torrent_state *state_00;
  bool bVar2;
  size_type sVar3;
  difference_type dVar4;
  bitfield_flag local_1a2;
  undefined1 local_1a1;
  uchar local_1a0;
  bitfield_flag local_19f;
  undefined1 local_19e;
  uchar local_19d;
  bitfield_flag local_19c;
  undefined1 local_19b;
  uchar local_19a;
  bitfield_flag local_199;
  iterator local_198;
  const_iterator local_178;
  iterator local_158;
  address local_130;
  iterator local_110;
  iterator local_f0;
  _Elt_pointer local_d0;
  _Elt_pointer local_c8;
  _Elt_pointer local_c0;
  _Map_pointer local_b8;
  string_view local_a8;
  iterator local_98;
  iterator local_78;
  _Elt_pointer local_58;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  _Map_pointer local_40;
  erase_peer_flags_t local_37;
  uchar local_36;
  bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void> local_35;
  int local_34;
  torrent_state *ptStack_30;
  int max_peerlist_size;
  torrent_state *state_local;
  iterator *iter_local;
  torrent_peer *p_local;
  peer_list *this_local;
  pex_flags_t flags_local;
  
  local_34 = state->max_peerlist_size;
  ptStack_30 = state;
  state_local = (torrent_state *)iter;
  iter_local = (iterator *)p;
  p_local = (torrent_peer *)this;
  this_local._6_1_ = flags.m_val;
  if ((local_34 != 0) &&
     (sVar3 = std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::
              size((deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *
                   )this), local_34 <= (int)sVar3)) {
    local_35.m_val = (uchar)torrent_peer::peer_source((torrent_peer *)iter_local);
    local_36 = '\x10';
    bVar2 = libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>
            ::operator==(&local_35,
                         (bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>)
                         '\x10');
    state_00 = ptStack_30;
    if (bVar2) {
      return false;
    }
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::erase_peer_flags_tag,_void>::
    bitfield_flag(&local_37);
    erase_peers(this,state_00,local_37);
    sVar3 = std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::
            size((deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)
                 this);
    if (local_34 <= (int)sVar3) {
      return false;
    }
    if ((*(uint *)((long)&iter_local->_M_node + 3) >> 0x18 & 1) == 0) {
      std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::begin
                (&local_f0,
                 (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)
                 this);
      std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::end
                (&local_110,
                 (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)
                 this);
      torrent_peer::address(&local_130,(torrent_peer *)iter_local);
      std::
      lower_bound<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,boost::asio::ip::address,libtorrent::peer_address_compare>
                (&local_d0,&local_f0,&local_110,&local_130);
      iter->_M_cur = local_d0;
      iter->_M_first = local_c8;
      iter->_M_last = local_c0;
      iter->_M_node = local_b8;
    }
    else {
      std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::begin
                (&local_78,
                 (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)
                 this);
      std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::end
                (&local_98,
                 (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)
                 this);
      local_a8 = torrent_peer::dest((torrent_peer *)iter_local);
      std::
      lower_bound<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,boost::basic_string_view<char,std::char_traits<char>>,libtorrent::peer_address_compare>
                (&local_58,&local_78,&local_98,&local_a8);
      iter->_M_cur = local_58;
      iter->_M_first = local_50;
      iter->_M_last = local_48;
      iter->_M_node = local_40;
    }
  }
  std::
  _Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*const&,libtorrent::torrent_peer*const*>
  ::
  _Deque_iterator<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,void>
            ((_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*const&,libtorrent::torrent_peer*const*>
              *)&local_178,iter);
  std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::insert
            (&local_158,
             (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)this,
             &local_178,(value_type *)&iter_local);
  iter->_M_cur = local_158._M_cur;
  iter->_M_first = local_158._M_first;
  iter->_M_last = local_158._M_last;
  iter->_M_node = local_158._M_node;
  iVar1 = this->m_round_robin;
  std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::begin
            (&local_198,
             (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)this)
  ;
  dVar4 = std::operator-(iter,&local_198);
  if (dVar4 <= iVar1) {
    this->m_round_robin = this->m_round_robin + 1;
  }
  local_19a = this_local._6_1_;
  local_19b = 2;
  local_199 = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)
                         this_local._6_1_,
                         (bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)0x2);
  bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_199);
  if (bVar2) {
    *(uint *)((long)&iter_local->_M_node + 3) =
         *(uint *)((long)&iter_local->_M_node + 3) & 0xffbfffff | 0x400000;
  }
  local_19d = this_local._6_1_;
  local_19e = 4;
  local_19c = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)
                         this_local._6_1_,
                         (bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)0x4);
  bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_19c);
  if (bVar2) {
    *(uint *)((long)&iter_local->_M_node + 3) =
         *(uint *)((long)&iter_local->_M_node + 3) & 0xffffff7f | 0x80;
    *(uint *)&this->field_0x60 =
         *(uint *)&this->field_0x60 & 0x80000000 |
         (*(uint *)&this->field_0x60 & 0x7fffffff) + 1 & 0x7fffffff;
  }
  local_1a0 = this_local._6_1_;
  local_1a1 = 8;
  local_19f = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)
                         this_local._6_1_,
                         (bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)0x8);
  bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_19f);
  if (bVar2) {
    *(uint *)((long)&iter_local->_M_node + 3) =
         *(uint *)((long)&iter_local->_M_node + 3) & 0xf7ffffff | 0x8000000;
  }
  local_1a2 = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)
                         this_local._6_1_,
                         (bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>)0x10);
  bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1a2);
  if (bVar2) {
    *(uint *)((long)&iter_local->_M_node + 3) =
         *(uint *)((long)&iter_local->_M_node + 3) & 0xdfffffff | 0x20000000;
  }
  bVar2 = is_connect_candidate(this,(torrent_peer *)iter_local);
  if (bVar2) {
    update_connect_candidates(this,1);
  }
  return true;
}

Assistant:

bool peer_list::insert_peer(torrent_peer* p, iterator iter
		, pex_flags_t const flags
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(p);
		TORRENT_ASSERT(p->in_use);

		int const max_peerlist_size = state->max_peerlist_size;

		if (max_peerlist_size
			&& int(m_peers.size()) >= max_peerlist_size)
		{
			if (p->peer_source() == peer_info::resume_data) return false;

			erase_peers(state);
			if (int(m_peers.size()) >= max_peerlist_size)
				return false;

			// since some peers were removed, we need to
			// update the iterator to make it valid again
#if TORRENT_USE_I2P
			if (p->is_i2p_addr)
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, p->dest(), peer_address_compare());
			}
			else
#endif
			iter = std::lower_bound(
				m_peers.begin(), m_peers.end()
				, p->address(), peer_address_compare());
		}

		iter = m_peers.insert(iter, p);

		if (m_round_robin >= iter - m_peers.begin()) ++m_round_robin;

#if !defined TORRENT_DISABLE_ENCRYPTION
		if (flags & pex_encryption) p->pe_support = true;
#endif
		if (flags & pex_seed)
		{
			p->seed = true;
			TORRENT_ASSERT(m_num_seeds < int(m_peers.size()));
			++m_num_seeds;
		}
		if (flags & pex_utp)
			p->supports_utp = true;
		if (flags & pex_holepunch)
			p->supports_holepunch = true;
		if (is_connect_candidate(*p))
			update_connect_candidates(1);

		return true;
	}